

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitStructNew(PrintExpressionContents *this,StructNew *curr)

{
  HeapType type;
  string_view str;
  string_view str_00;
  
  str._M_str = "struct.new";
  str._M_len = 10;
  printMedium(this->o,str);
  if ((curr->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements == 0) {
    str_00._M_str = "_default";
    str_00._M_len = 8;
    printMedium(this->o,str_00);
  }
  std::operator<<(this->o,' ');
  type = wasm::Type::getHeapType
                   (&(curr->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression.
                     type);
  printHeapTypeName(this,type);
  return;
}

Assistant:

void visitStructNew(StructNew* curr) {
    printMedium(o, "struct.new");
    if (curr->isWithDefault()) {
      printMedium(o, "_default");
    }
    o << ' ';
    printHeapTypeName(curr->type.getHeapType());
  }